

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractListView<QColor>::dataChanged(AbstractListView<QColor> *this,int first,int last)

{
  AbstractListViewPrivate<QColor> *this_00;
  AbstractListViewPrivate<QColor> *d;
  int last_local;
  int first_local;
  AbstractListView<QColor> *this_local;
  
  this_00 = d_func(this);
  (**(code **)(*(long *)&(this->super_AbstractListViewBase).super_AbstractScrollArea + 0x1b8))();
  AbstractListViewPrivate<QColor>::updateIfNeeded(this_00,first,last);
  return;
}

Assistant:

void dataChanged( int first, int last ) override
	{
		AbstractListViewPrivate< T > * d = d_func();

		recalculateSize();

		d->updateIfNeeded( first, last );
	}